

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O2

void cf_scache_peer_remove_expired(Curl_ssl_scache_peer *peer,curl_off_t now)

{
  Curl_llist_node *n;
  Curl_ssl_session *s;
  
  n = Curl_llist_head(&peer->sessions);
  while (n != (Curl_llist_node *)0x0) {
    s = (Curl_ssl_session *)Curl_node_elem(n);
    n = Curl_node_next(n);
    if (s->valid_until < now && 0 < s->valid_until) {
      Curl_ssl_session_destroy(s);
    }
  }
  return;
}

Assistant:

static void cf_scache_peer_remove_expired(struct Curl_ssl_scache_peer *peer,
                                          curl_off_t now)
{
  struct Curl_llist_node *n = Curl_llist_head(&peer->sessions);
  while(n) {
    struct Curl_ssl_session *s = Curl_node_elem(n);
    n = Curl_node_next(n);
    if(cf_scache_session_expired(s, now))
      cf_scache_session_remove(peer, s);
  }
}